

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O2

Value * __thiscall flow::IRBuilder::createS2N(IRBuilder *this,Value *rhs,string *name)

{
  int iVar1;
  long lVar2;
  ConstantInt *pCVar3;
  Value *rhs_local;
  LiteralType local_44;
  string local_40;
  
  rhs_local = rhs;
  if (rhs->type_ == String) {
    lVar2 = __dynamic_cast(rhs,&Value::typeinfo,
                           &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo,0);
    if (lVar2 == 0) {
      local_44 = Number;
      makeName(&local_40,this,name);
      pCVar3 = (ConstantInt *)
               insert<flow::CastInstr,flow::LiteralType,flow::Value*&,std::__cxx11::string>
                         (this,&local_44,&rhs_local,&local_40);
    }
    else {
      std::__cxx11::string::string((string *)&local_40,(string *)(lVar2 + 0x48));
      iVar1 = std::__cxx11::stoi(&local_40,(size_t *)0x0,10);
      pCVar3 = get(this,(long)iVar1);
    }
    std::__cxx11::string::~string((string *)&local_40);
    return (Value *)pCVar3;
  }
  __assert_fail("rhs->type() == LiteralType::String",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                ,0x26b,"Value *flow::IRBuilder::createS2N(Value *, const std::string &)");
}

Assistant:

Value* IRBuilder::createS2N(Value* rhs, const std::string& name) {
  assert(rhs->type() == LiteralType::String);

  if (auto value = dynamic_cast<ConstantString*>(rhs)) {
    try {
      return get(stoi(value->get()));
    } catch (...) {
      // fall through to default behaviour
    }
  }

  return insert<CastInstr>(LiteralType::Number, rhs, makeName(name));
}